

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O1

void __thiscall QWidgetAction::~QWidgetAction(QWidgetAction *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QArrayData *pQVar4;
  long *plVar5;
  long lVar6;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007fa5b0;
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x1c8);
  if (lVar2 != 0) {
    lVar3 = *(long *)(lVar1 + 0x1c0);
    lVar6 = 0;
    do {
      local_48 = QObject::destroyed;
      local_40 = 0;
      local_58 = QWidgetActionPrivate::widgetDestroyed;
      local_50 = 0;
      QObject::disconnectImpl
                (*(QObject **)(lVar3 + lVar6),&local_48,*(QObject **)(lVar1 + 8),&local_58,
                 (QMetaObject *)&QObject::staticMetaObject);
      lVar6 = lVar6 + 8;
    } while (lVar2 << 3 != lVar6);
  }
  pQVar4 = *(QArrayData **)(lVar1 + 0x1b8);
  lVar2 = *(long *)(lVar1 + 0x1c0);
  lVar3 = *(long *)(lVar1 + 0x1c8);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)(lVar1 + 0x1b8));
  if (lVar3 != 0) {
    lVar6 = 0;
    do {
      plVar5 = *(long **)(lVar2 + lVar6);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x20))();
      }
      lVar6 = lVar6 + 8;
    } while (lVar3 << 3 != lVar6);
  }
  if ((*(long *)(lVar1 + 0x1a8) == 0) || (*(int *)(*(long *)(lVar1 + 0x1a8) + 4) == 0)) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = *(long **)(lVar1 + 0x1b0);
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x20))();
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
  QAction::~QAction(&this->super_QAction);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetAction::~QWidgetAction()
{
    Q_D(QWidgetAction);
    for (QWidget *w : std::as_const(d->createdWidgets))
        QObjectPrivate::disconnect(w, &QWidget::destroyed,
                                   d, &QWidgetActionPrivate::widgetDestroyed);
    QList<QWidget *> widgetsToDelete = d->createdWidgets;
    d->createdWidgets.clear();
    qDeleteAll(widgetsToDelete);
    delete d->defaultWidget;
}